

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

char * luaL_findtable(lua_State *L,int idx,char *fname,int szhint)

{
  StkId pTVar1;
  TValue *pTVar2;
  char *pcVar3;
  size_t sVar4;
  int narray;
  
  pTVar2 = index2adr(L,idx);
  pTVar1 = L->top;
  pTVar1->value = pTVar2->value;
  pTVar1->tt = pTVar2->tt;
  L->top = L->top + 1;
  while( true ) {
    pcVar3 = strchr(fname,0x2e);
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(fname);
      pcVar3 = fname + sVar4;
    }
    lua_pushlstring(L,fname,(long)pcVar3 - (long)fname);
    pTVar1 = L->top;
    pTVar2 = luaH_get(&(pTVar1[-2].value.gc)->h,pTVar1 + -1);
    pTVar1[-1].value = pTVar2->value;
    pTVar1[-1].tt = pTVar2->tt;
    pTVar1 = L->top;
    if (pTVar1 + -1 == &luaO_nilobject_) break;
    if (pTVar1[-1].tt != 5) {
      if (pTVar1[-1].tt != 0) break;
      L->top = pTVar1 + -1;
      narray = 1;
      if (*pcVar3 != '.') {
        narray = szhint;
      }
      lua_createtable(L,narray,0);
      lua_pushlstring(L,fname,(long)pcVar3 - (long)fname);
      pTVar1 = L->top;
      pTVar1->value = pTVar1[-2].value;
      pTVar1->tt = pTVar1[-2].tt;
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      luaV_settable(L,pTVar1 + -3,pTVar1 + -1,pTVar1);
      L->top = L->top + -2;
    }
    lua_remove(L,-2);
    fname = pcVar3 + 1;
    if (*pcVar3 != '.') {
      return (char *)0x0;
    }
  }
  L->top = pTVar1 + -2;
  return fname;
}

Assistant:

static const char*luaL_findtable(lua_State*L,int idx,
const char*fname,int szhint){
const char*e;
lua_pushvalue(L,idx);
do{
e=strchr(fname,'.');
if(e==NULL)e=fname+strlen(fname);
lua_pushlstring(L,fname,e-fname);
lua_rawget(L,-2);
if(lua_isnil(L,-1)){
lua_pop(L,1);
lua_createtable(L,0,(*e=='.'?1:szhint));
lua_pushlstring(L,fname,e-fname);
lua_pushvalue(L,-2);
lua_settable(L,-4);
}
else if(!lua_istable(L,-1)){
lua_pop(L,2);
return fname;
}
lua_remove(L,-2);
fname=e+1;
}while(*e=='.');
return NULL;
}